

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O2

void __thiscall Clasp::ScoreLook::scoreLits(ScoreLook *this,Solver *s,Literal *b,Literal *e)

{
  bool bVar1;
  uint32 value;
  ulong uVar2;
  byte bVar3;
  pointer pVVar4;
  VarType VVar5;
  uint lhs;
  Literal LVar6;
  uint local_3c;
  VarVec *local_38;
  
  if (this->nant == false) {
    value = (uint32)((ulong)((long)e - (long)b) >> 2);
  }
  else {
    value = countNant(this,s,b,e);
  }
  LVar6 = (Literal)b->rep_;
  VarScore::setScore((VarScore *)(&((this->score).ebo_.buf)->field_0x0 + (LVar6.rep_ & 0xfffffffc)),
                     LVar6,value);
  if (this->addDeps == true) {
    lhs = LVar6.rep_ >> 2;
    if ((0xbfffffff < (uint)(this->score).ebo_.buf[lhs]) || (this->mode == score_max)) {
      bVar1 = greater(this,lhs,this->best);
      if (bVar1) {
        this->best = lhs;
      }
    }
    local_38 = &this->deps;
    for (; b != e; b = b + 1) {
      LVar6.rep_ = b->rep_;
      local_3c = LVar6.rep_ >> 2;
      if (local_3c < (this->score).ebo_.size) {
        if (local_3c < (s->shared_->varInfo_).ebo_.size) {
          bVar3 = (s->shared_->varInfo_).ebo_.buf[local_3c].rep;
        }
        else {
          bVar3 = 0;
        }
        VVar5 = Body - ((bVar3 & 8) == 0);
        if ((bVar3 & 0x10) != 0) {
          VVar5 = Hybrid;
        }
        if ((this->types & VVar5) != 0) {
          pVVar4 = (this->score).ebo_.buf;
          uVar2 = (ulong)local_3c;
          if ((pVVar4[uVar2].field_0x3 & 0x30) == 0) {
            bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (local_38,&local_3c);
            uVar2 = (ulong)local_3c;
            pVVar4 = (this->score).ebo_.buf;
            LVar6.rep_ = b->rep_;
          }
          VarScore::setDepScore(pVVar4 + uVar2,LVar6,value);
          pVVar4 = (this->score).ebo_.buf + local_3c;
          *pVVar4 = (VarScore)((uint)*pVVar4 | (b->rep_ & 2) * 0x8000000 + 0x10000000);
        }
      }
    }
  }
  return;
}

Assistant:

void ScoreLook::scoreLits(const Solver& s, const Literal* b, const Literal *e) {
	assert(b < e);
	uint32 sc = !nant ? uint32(e-b) : countNant(s, b, e);
	Var v     = b->var();
	assert(validVar(v));
	score[v].setScore(*b, sc);
	if (addDeps) {
		if ((score[v].testedBoth() || mode == score_max) && greater(v, best)) {
			best = v;
		}
		for (; b != e; ++b) {
			v = b->var();
			if (validVar(v) && (s.varInfo(v).type() & types) != 0) {
				if (!score[v].seen()) { deps.push_back(v); }
				score[v].setDepScore(*b, sc);
				score[v].setSeen(*b);
			}
		}
	}
}